

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2ktx2.cpp
# Opt level: O0

void __thiscall ktxUpgrader::ktxUpgrader(ktxUpgrader *this)

{
  iterator __last;
  undefined8 *in_RDI;
  commandOptions *in_stack_00000028;
  string *in_stack_00000030;
  string *in_stack_00000038;
  ktxApp *in_stack_00000040;
  int lastOptionIndex;
  option my_option_list [3];
  vector<argparser::option,_std::allocator<argparser::option>_> *in_stack_ffffffffffffff38;
  commandOptions *in_stack_ffffffffffffff40;
  __normal_iterator<const_argparser::option_*,_std::vector<argparser::option,_std::allocator<argparser::option>_>_>
  *this_00;
  option *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar1;
  const_iterator in_stack_ffffffffffffff88;
  option local_58;
  option local_38;
  
  *in_RDI = &PTR_main_0014a9e8;
  ktxApp::ktxApp(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  *in_RDI = &PTR_main_0014a9e8;
  commandOptions::commandOptions(in_stack_ffffffffffffff40);
  argparser::option::option((option *)&stack0xffffffffffffff88,"force",no_argument,(int *)0x0,0x66);
  argparser::option::option(&local_58,"outfile",required_argument,(int *)0x0,0x6f);
  argparser::option::option(&local_38,"rewritebado",no_argument,(int *)0x0,0x62);
  uVar1 = 3;
  this_00 = (__normal_iterator<const_argparser::option_*,_std::vector<argparser::option,_std::allocator<argparser::option>_>_>
             *)(in_RDI + 8);
  __last = std::vector<argparser::option,_std::allocator<argparser::option>_>::begin
                     (in_stack_ffffffffffffff38);
  __gnu_cxx::
  __normal_iterator<argparser::option_const*,std::vector<argparser::option,std::allocator<argparser::option>>>
  ::__normal_iterator<argparser::option*>
            (this_00,(__normal_iterator<argparser::option_*,_std::vector<argparser::option,_std::allocator<argparser::option>_>_>
                      *)in_stack_ffffffffffffff38);
  std::vector<argparser::option,std::allocator<argparser::option>>::insert<argparser::option*,void>
            ((vector<argparser::option,_std::allocator<argparser::option>_> *)
             CONCAT44(uVar1,in_stack_ffffffffffffff80),in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff78,__last._M_current);
  std::__cxx11::string::operator+=((string *)(in_RDI + 0xb),"bd:fo:");
  return;
}

Assistant:

ktxUpgrader::ktxUpgrader() : ktxApp(myversion, mydefversion, options)
{
    argparser::option my_option_list[] = {
        { "force", argparser::option::no_argument, NULL, 'f' },
        { "outfile", argparser::option::required_argument, NULL, 'o' },
        { "rewritebado", argparser::option::no_argument, NULL, 'b' },
    };
    const int lastOptionIndex = sizeof(my_option_list)
                                / sizeof(argparser::option);
    option_list.insert(option_list.begin(), my_option_list,
                       my_option_list + lastOptionIndex);
    short_opts += "bd:fo:";
}